

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cMultiBindTests.cpp
# Opt level: O3

IterateResult __thiscall
gl4cts::MultiBind::FunctionalBindSamplersTest::iterate(FunctionalBindSamplersTest *this)

{
  ostringstream *this_00;
  Context *pCVar1;
  char cVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  TestError *this_01;
  long lVar6;
  GLuint index;
  uint uVar7;
  GLuint GVar8;
  ulong uVar9;
  char *__end_1;
  char *__end;
  GLint max_samplers;
  vector<unsigned_int,_std::allocator<unsigned_int>_> t_sampler_ids;
  vector<unsigned_int,_std::allocator<unsigned_int>_> sampler_ids;
  uint local_21c;
  FunctionalBindSamplersTest *local_218;
  long local_210;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_208;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1e8;
  undefined1 local_1d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0 [6];
  ios_base local_158 [264];
  Enum<int,_2UL> local_50;
  Enum<int,_2UL> local_40;
  long lVar5;
  
  local_218 = this;
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  local_21c = 0;
  (**(code **)(lVar5 + 0x868))(0x8b4d,&local_21c);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0xb60);
  local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&local_1e8,(long)(int)local_21c);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&local_208,(long)(int)local_21c);
  uVar9 = (ulong)local_21c;
  if (0 < (int)local_21c) {
    lVar6 = 0;
    do {
      local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[lVar6] = 0;
      lVar6 = lVar6 + 1;
      uVar9 = (ulong)(int)local_21c;
    } while (lVar6 < (long)uVar9);
  }
  (**(code **)(lVar5 + 0x6f0))
            (uVar9,local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"GenSamplers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0xb70);
  local_210 = lVar5;
  (**(code **)(lVar5 + 0xb0))
            (0,local_21c,
             local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"BindSamplers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0xb78);
  uVar9 = (ulong)local_21c;
  if (0 < (int)local_21c) {
    lVar6 = 0;
    do {
      pCVar1 = (local_218->super_TestCase).m_context;
      local_1d0._0_8_ = local_1c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"Sampler","");
      checkBinding(pCVar1,0x8919,(GLuint)lVar6,(string *)local_1d0,
                   local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start[lVar6]);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._0_8_ != local_1c0) {
        operator_delete((void *)local_1d0._0_8_,local_1c0[0]._M_allocated_capacity + 1);
      }
      lVar6 = lVar6 + 1;
      uVar9 = (ulong)(int)local_21c;
      lVar5 = local_210;
    } while (lVar6 < (long)uVar9);
  }
  GVar8 = (int)(((uint)(uVar9 >> 0x1f) & 1) + (int)uVar9) >> 1;
  (**(code **)(lVar5 + 0xb0))
            (0,GVar8,local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"BindSamplers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0xb86);
  if (1 < (int)uVar9) {
    index = 0;
    do {
      pCVar1 = (local_218->super_TestCase).m_context;
      local_1d0._0_8_ = local_1c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"Sampler","");
      checkBinding(pCVar1,0x8919,index,(string *)local_1d0,0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._0_8_ != local_1c0) {
        operator_delete((void *)local_1d0._0_8_,local_1c0[0]._M_allocated_capacity + 1);
      }
      index = index + 1;
    } while (GVar8 != index);
  }
  lVar5 = local_210;
  if ((int)GVar8 < (int)local_21c) {
    lVar6 = (long)(int)GVar8;
    do {
      pCVar1 = (local_218->super_TestCase).m_context;
      local_1d0._0_8_ = local_1c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"Sampler","");
      checkBinding(pCVar1,0x8919,(GLuint)lVar6,(string *)local_1d0,
                   local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start[lVar6]);
      lVar5 = local_210;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._0_8_ != local_1c0) {
        operator_delete((void *)local_1d0._0_8_,local_1c0[0]._M_allocated_capacity + 1);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < (int)local_21c);
  }
  (**(code **)(lVar5 + 0xb0))(GVar8,local_21c - GVar8,0);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"BindSamplers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0xb97);
  if (0 < (int)local_21c) {
    GVar8 = 0;
    do {
      pCVar1 = (local_218->super_TestCase).m_context;
      local_1d0._0_8_ = local_1c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"Sampler","");
      checkBinding(pCVar1,0x8919,GVar8,(string *)local_1d0,0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._0_8_ != local_1c0) {
        operator_delete((void *)local_1d0._0_8_,local_1c0[0]._M_allocated_capacity + 1);
      }
      GVar8 = GVar8 + 1;
    } while ((int)GVar8 < (int)local_21c);
  }
  lVar5 = local_210;
  uVar7 = 1;
  while (cVar2 = (**(code **)(lVar5 + 0xcb0))(uVar7), cVar2 == '\x01') {
    uVar7 = uVar7 + 1;
  }
  *local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = uVar7;
  if (1 < (int)local_21c) {
    lVar6 = 1;
    do {
      local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[lVar6] =
           local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 < (int)local_21c);
  }
  (**(code **)(lVar5 + 0xb0))(0);
  iVar3 = (**(code **)(lVar5 + 0x800))();
  if (iVar3 != 0x502) {
    local_1d0._0_8_ = ((local_218->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1d0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"File: ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
               ,0x7f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", line: ",8);
    std::ostream::operator<<(this_00,0xbb9);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,". Got wrong error: ",0x13);
    local_40.m_getName = glu::getErrorName;
    local_40.m_value = iVar3;
    tcu::Format::Enum<int,_2UL>::toStream(&local_40,(ostream *)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", expected: ",0xc);
    local_50.m_getName = glu::getErrorName;
    local_50.m_value = 0x502;
    tcu::Format::Enum<int,_2UL>::toStream(&local_50,(ostream *)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", message: ",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"BindSamplers with invalid sampler id",0x24);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_158);
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
               ,0xbb9);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  *local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  uVar9 = (ulong)local_21c;
  if (0 < (int)local_21c) {
    lVar6 = 0;
    do {
      pCVar1 = (local_218->super_TestCase).m_context;
      local_1d0._0_8_ = local_1c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"Sampler","");
      checkBinding(pCVar1,0x8919,(GLuint)lVar6,(string *)local_1d0,
                   local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start[lVar6]);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._0_8_ != local_1c0) {
        operator_delete((void *)local_1d0._0_8_,local_1c0[0]._M_allocated_capacity + 1);
      }
      lVar6 = lVar6 + 1;
      uVar9 = (ulong)(int)local_21c;
      lVar5 = local_210;
    } while (lVar6 < (long)uVar9);
  }
  (**(code **)(lVar5 + 0xb0))(0,uVar9,0);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"BindSamplers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0xbc5);
  (**(code **)(lVar5 + 0x468))(local_21c);
  tcu::TestContext::setTestResult
            (((local_218->super_TestCase).m_context)->m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  if (local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult FunctionalBindSamplersTest::iterate()
{
	const Functions& gl = m_context.getRenderContext().getFunctions();

#if DEBUG_ENBALE_MESSAGE_CALLBACK
	gl.debugMessageCallback(debug_proc, &m_context);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DebugMessageCallback");
#endif /* DEBUG_ENBALE_MESSAGE_CALLBACK */

	GLuint invalid_id   = 1; /* Start with 1, as 0 is not valid name */
	GLint  max_samplers = 0;

	/* Get max */
	gl.getIntegerv(GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS, &max_samplers);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

	/* Storage */
	std::vector<GLuint> sampler_ids;
	std::vector<GLuint> t_sampler_ids;

	sampler_ids.resize(max_samplers);
	t_sampler_ids.resize(max_samplers);

	for (GLint i = 0; i < max_samplers; ++i)
	{
		t_sampler_ids[i] = 0;
	}

	/* Prepare samplers */
	gl.genSamplers(max_samplers, &sampler_ids[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GenSamplers");

	try
	{
		/* - execute BindSamplers to bind all samplers;
		 * - inspect bindings to verify that proper samplers were set;
		 */
		gl.bindSamplers(0 /* first */, max_samplers /* count */, &sampler_ids[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindSamplers");

		for (GLint i = 0; i < max_samplers; ++i)
		{
			checkBinding(m_context, GL_SAMPLER_BINDING, i, "Sampler", sampler_ids[i]);
		}

		/* - execute BindSamplers for first half of bindings with <samplers> filled
		 * with zeros, to unbind those samplers;
		 * - inspect bindings to verify that proper samplers were unbound;
		 */
		GLint half_index = max_samplers / 2;

		gl.bindSamplers(0, half_index, &t_sampler_ids[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindSamplers");

		for (GLint i = 0; i < half_index; ++i)
		{
			checkBinding(m_context, GL_SAMPLER_BINDING, i, "Sampler", 0);
		}

		for (GLint i = half_index; i < max_samplers; ++i)
		{
			checkBinding(m_context, GL_SAMPLER_BINDING, i, "Sampler", sampler_ids[i]);
		}

		/* - execute BindSamplers for second half of bindings with NULL as <samplers>,
		 * to unbind those samplers;
		 * - inspect bindings to verify that proper samplers were unbound;
		 */
		gl.bindSamplers(half_index, max_samplers - half_index, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindSamplers");

		for (GLint i = 0; i < max_samplers; ++i)
		{
			checkBinding(m_context, GL_SAMPLER_BINDING, i, "Sampler", 0);
		}

		/* - modify <samplers> so first entry is invalid;
		 * - execute BindSamplers to bind all samplers; It is expected that
		 * INVALID_OPERATION will be generated;
		 * - inspect bindings to verify that proper samplers were set;
		 */

		/* Find invalid id */
		while (1)
		{
			if (GL_TRUE != gl.isSampler(invalid_id))
			{
				break;
			}

			invalid_id += 1;
		}

		/* Prepare ids */
		t_sampler_ids[0] = invalid_id;

		for (GLint i = 1; i < max_samplers; ++i)
		{
			t_sampler_ids[i] = sampler_ids[i];
		}

		/* Bind */
		gl.bindSamplers(0, max_samplers, &t_sampler_ids[0]);
		CHECK_ERROR(GL_INVALID_OPERATION, "BindSamplers with invalid sampler id");

		/* Set 0 for invalid entry */
		t_sampler_ids[0] = 0;

		for (GLint i = 0; i < max_samplers; ++i)
		{
			checkBinding(m_context, GL_SAMPLER_BINDING, i, "Sampler", t_sampler_ids[i]);
		}

		/* - unbind all samplers. */
		gl.bindSamplers(0, max_samplers, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindSamplers");
	}
	catch (const std::exception&)
	{
		gl.deleteSamplers(max_samplers, &sampler_ids[0]);

		TCU_FAIL("Invalid error generated");
	}

	/* Delete samplers */
	gl.deleteSamplers(max_samplers, &sampler_ids[0]);

	/* Set result */
	m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");

	/* Done */
	return tcu::TestNode::STOP;
}